

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall spvtools::opt::Loop::SetMergeBlock(Loop *this,BasicBlock *merge)

{
  bool bVar1;
  Instruction *pIVar2;
  
  if (merge->function_ == (Function *)0x0) {
    __assert_fail("merge->GetParent() && \"The basic block does not belong to a function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x132,"void spvtools::opt::Loop::SetMergeBlock(BasicBlock *)");
  }
  bVar1 = IsInsideLoop(this,merge);
  if (!bVar1) {
    this->loop_merge_ = merge;
    pIVar2 = BasicBlock::GetLoopMergeInst(this->loop_header_);
    if (pIVar2 != (Instruction *)0x0) {
      UpdateLoopMergeInst(this);
      return;
    }
    return;
  }
  __assert_fail("!IsInsideLoop(merge) && \"The merge block is in the loop\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x134,"void spvtools::opt::Loop::SetMergeBlock(BasicBlock *)");
}

Assistant:

void Loop::SetMergeBlock(BasicBlock* merge) {
#ifndef NDEBUG
  assert(merge->GetParent() && "The basic block does not belong to a function");
#endif  // NDEBUG
  assert(!IsInsideLoop(merge) && "The merge block is in the loop");

  SetMergeBlockImpl(merge);
  if (GetHeaderBlock()->GetLoopMergeInst()) {
    UpdateLoopMergeInst();
  }
}